

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

void __thiscall
embree::SceneGraph::AnimatedPerspectiveCameraNode::print
          (AnimatedPerspectiveCameraNode *this,ostream *cout,int depth)

{
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  reference pvVar4;
  int in_EDX;
  ostream *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_t i;
  char *in_stack_ffffffffffffffc8;
  size_type sVar5;
  int n;
  size_type local_28;
  
  poVar2 = std::operator<<(in_RSI,"AnimatedPerspectiveCameraNode @ ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_RDI);
  poVar2 = std::operator<<(poVar2," { ");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  bVar1 = std::operator!=(in_RDI,in_stack_ffffffffffffffc8);
  if (bVar1) {
    tab((ostream *)in_RDI,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
    poVar2 = std::operator<<(in_RSI,"name = ");
    poVar2 = std::operator<<(poVar2,(string *)in_RDI[1].field_2._M_local_buf);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  local_28 = 0;
  while( true ) {
    sVar5 = local_28;
    sVar3 = std::
            vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
            ::size((vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                    *)((long)&in_RDI[5].field_2 + 8));
    n = (int)(sVar5 >> 0x20);
    if (sVar3 <= sVar5) break;
    tab((ostream *)in_RDI,n);
    pvVar4 = std::
             vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
             ::operator[]((vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                           *)((long)&in_RDI[5].field_2 + 8),local_28);
    (*(pvVar4->ptr->super_Node).super_RefCount._vptr_RefCount[4])
              (pvVar4->ptr,in_RSI,(ulong)(in_EDX + 1));
    local_28 = local_28 + 1;
  }
  tab((ostream *)in_RDI,n);
  poVar2 = std::operator<<(in_RSI,"}");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void SceneGraph::AnimatedPerspectiveCameraNode::print(std::ostream& cout, int depth) {
    cout << "AnimatedPerspectiveCameraNode @ " << this << " { " << std::endl;
    if (name != "") {
      tab(cout, depth+1); cout << "name = " << name << std::endl;
    }
    for (size_t i=0; i<cameras.size(); i++) {
      tab(cout,depth+1); cameras[i]->print(cout,depth+1);
    }
    tab(cout, depth); cout << "}" << std::endl;
  }